

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::compiler::Version::InternalSerializeWithCachedSizesToArray
          (Version *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  void *pvVar3;
  bool bVar4;
  uint8 *puVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    uVar7 = (ulong)this->major_;
    pbVar6 = target + 1;
    *target = '\b';
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar8;
    target = pbVar6 + 1;
  }
  if ((uVar1 & 4) != 0) {
    uVar7 = (ulong)this->minor_;
    pbVar6 = target + 1;
    *target = 0x10;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar8;
    target = pbVar6 + 1;
  }
  if ((uVar1 & 8) != 0) {
    uVar7 = (ulong)this->patch_;
    pbVar6 = target + 1;
    *target = 0x18;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar4 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    *pbVar6 = (byte)uVar8;
    target = pbVar6 + 1;
  }
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->suffix_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.compiler.Version.suffix");
    psVar2 = (this->suffix_).ptr_;
    *target = 0x22;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* Version::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.Version)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 major = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->major(), target);
  }

  // optional int32 minor = 2;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->minor(), target);
  }

  // optional int32 patch = 3;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->patch(), target);
  }

  // optional string suffix = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->suffix().data(), this->suffix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.Version.suffix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->suffix(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.Version)
  return target;
}